

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O3

void __thiscall
pbrt::FormattingScene::LookAt
          (FormattingScene *this,Float ex,Float ey,Float ez,Float lx,Float ly,Float lz,Float ux,
          Float uy,Float uz,FileLoc loc)

{
  Float uy_local;
  Float ux_local;
  Float lz_local;
  Float ly_local;
  Float lx_local;
  Float ez_local;
  Float ey_local;
  Float ex_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  uy_local = uy;
  ux_local = ux;
  lz_local = lz;
  ly_local = ly;
  lx_local = lx;
  ez_local = ez;
  ey_local = ey;
  ex_local = ex;
  std::__cxx11::string::_M_construct
            ((ulong)&local_90,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_70,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct
            ((ulong)&local_50,(char)*(undefined4 *)&(this->super_SceneRepresentation).field_0xc);
  Printf<std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&,std::__cxx11::string,float&,float&,float&>
            ("%sLookAt %f %f %f\n%s    %f %f %f\n%s    %f %f %f\n",&local_90,&ex_local,&ey_local,
             &ez_local,&local_70,&lx_local,&ly_local,&lz_local,&local_50,&ux_local,&uy_local,&uz);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void FormattingScene::LookAt(Float ex, Float ey, Float ez, Float lx, Float ly, Float lz,
                             Float ux, Float uy, Float uz, FileLoc loc) {
    Printf("%sLookAt %f %f %f\n%s    %f %f %f\n%s    %f %f %f\n", indent(), ex, ey, ez,
           indent(), lx, ly, lz, indent(), ux, uy, uz);
}